

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O1

void destroy_test_suite(TestSuite *suiteToDestroy)

{
  UnitTest *pUVar1;
  TestSuite *suiteToDestroy_00;
  long lVar2;
  long lVar3;
  
  if (0 < suiteToDestroy->size) {
    lVar2 = 0x10;
    lVar3 = 0;
    do {
      pUVar1 = suiteToDestroy->tests;
      suiteToDestroy_00 = *(TestSuite **)((long)&pUVar1->type + lVar2);
      if (suiteToDestroy_00 != (TestSuite *)0x0 && *(int *)((long)pUVar1 + lVar2 + -0x10) == 1) {
        *(undefined8 *)((long)&pUVar1->type + lVar2) = 0;
        destroy_test_suite(suiteToDestroy_00);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (lVar3 < suiteToDestroy->size);
  }
  if (suiteToDestroy->tests != (UnitTest *)0x0) {
    free(suiteToDestroy->tests);
  }
  free(suiteToDestroy);
  return;
}

Assistant:

void destroy_test_suite(TestSuite *suiteToDestroy) {
    int i;
    for (i = 0; i < suiteToDestroy->size; i++) {
        UnitTest test = suiteToDestroy->tests[i];
        TestSuite* suite = test.Runnable.suite;
        if (test_suite == test.type && suite != NULL) {
           suiteToDestroy->tests[i].Runnable.suite = NULL;
           destroy_test_suite(suite);
        }
    }

    if (suiteToDestroy->tests != NULL)
        free(suiteToDestroy->tests);

    free(suiteToDestroy);
}